

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O0

int __thiscall piksel::Font::_load(Font *this,uchar *fontBuffer)

{
  Point2 p3;
  Point2 p2;
  Point2 p1;
  Point2 p0;
  Point2 p2_00;
  Point2 p1_00;
  Point2 p0_00;
  Point2 p1_01;
  Point2 p0_01;
  int iVar1;
  stbtt_fontinfo *psVar2;
  Vector2 *local_258;
  undefined1 local_238 [8];
  Letter letter;
  double local_210;
  EdgeHolder local_1c0;
  Vector2 local_1b8;
  Vector2 local_1a8;
  Vector2 local_198;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  EdgeHolder local_150;
  Vector2 local_148;
  Vector2 local_138;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  EdgeHolder local_108;
  Vector2 local_100;
  Contour local_f0;
  stbtt_vertex *local_d8;
  stbtt_vertex *vertex;
  undefined1 auStack_c8 [4];
  int i;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  Vector2 VStack_88;
  EdgeHolder local_78;
  EdgeHolder edge;
  Contour contour;
  Shape shape;
  stbtt_vertex *psStack_30;
  int num_verts;
  stbtt_vertex *vertices;
  uchar *puStack_20;
  char ch;
  uchar *fontBuffer_local;
  Font *this_local;
  
  puStack_20 = fontBuffer;
  fontBuffer_local = (uchar *)this;
  psVar2 = (stbtt_fontinfo *)operator_new(0xa0);
  memset(psVar2,0,0xa0);
  this->info = psVar2;
  iVar1 = stbtt_InitFont(this->info,puStack_20,0);
  if (iVar1 == 0) {
    fputs("Failed to load font",_stderr);
    this_local._4_4_ = 0;
  }
  else {
    stbtt_GetFontVMetrics(this->info,&this->ascent,&this->descent,&this->lineGap);
    stbtt_GetFontBoundingBox(this->info,&this->x0,&this->y1,&this->x1,&this->y1);
    for (vertices._7_1_ = ' '; vertices._7_1_ < '\x7f'; vertices._7_1_ = vertices._7_1_ + '\x01') {
      psVar2 = this->info;
      iVar1 = stbtt_FindGlyphIndex(psVar2,(int)vertices._7_1_);
      iVar1 = stbtt_GetGlyphShape(psVar2,iVar1,&stack0xffffffffffffffd0);
      msdfgen::Shape::Shape
                ((Shape *)&contour.edges.
                           super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      msdfgen::Contour::Contour((Contour *)&edge);
      msdfgen::EdgeHolder::EdgeHolder(&local_78);
      local_258 = (Vector2 *)auStack_c8;
      do {
        msdfgen::Vector2::Vector2(local_258,0.0);
        local_258 = local_258 + 1;
      } while (local_258 != &VStack_88);
      for (vertex._4_4_ = 0; vertex._4_4_ < iVar1; vertex._4_4_ = vertex._4_4_ + 1) {
        local_d8 = psStack_30 + vertex._4_4_;
        switch(local_d8->type) {
        case '\x01':
          if (0 < vertex._4_4_) {
            msdfgen::Shape::addContour
                      ((Shape *)&contour.edges.
                                 super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(Contour *)&edge
                      );
            memset(&local_f0,0,0x18);
            msdfgen::Contour::Contour(&local_f0);
            msdfgen::Contour::operator=((Contour *)&edge,&local_f0);
            msdfgen::Contour::~Contour(&local_f0);
          }
          break;
        case '\x02':
          msdfgen::Vector2::Vector2(&local_100,(double)(int)local_d8->x,(double)(int)local_d8->y);
          local_b8 = local_100.x;
          dStack_b0 = local_100.y;
          local_118 = _auStack_c8;
          dStack_110 = dStack_c0;
          local_128 = local_100.x;
          dStack_120 = local_100.y;
          p0_01.y = dStack_c0;
          p0_01.x = _auStack_c8;
          p1_01.y = local_100.y;
          p1_01.x = local_100.x;
          msdfgen::EdgeHolder::EdgeHolder(&local_108,p0_01,p1_01,WHITE);
          msdfgen::Contour::addEdge((Contour *)&edge,&local_108);
          msdfgen::EdgeHolder::~EdgeHolder(&local_108);
          break;
        case '\x03':
          msdfgen::Vector2::Vector2(&local_138,(double)(int)local_d8->cx,(double)(int)local_d8->cy);
          local_b8 = local_138.x;
          dStack_b0 = local_138.y;
          msdfgen::Vector2::Vector2(&local_148,(double)(int)local_d8->x,(double)(int)local_d8->y);
          local_a8 = local_148.x;
          dStack_a0 = local_148.y;
          local_168 = _auStack_c8;
          dStack_160 = dStack_c0;
          local_178 = local_b8;
          dStack_170 = dStack_b0;
          local_188 = local_148.x;
          dStack_180 = local_148.y;
          p0_00.y = dStack_c0;
          p0_00.x = _auStack_c8;
          p1_00.y = dStack_b0;
          p1_00.x = local_b8;
          p2_00.y = local_148.y;
          p2_00.x = local_148.x;
          msdfgen::EdgeHolder::EdgeHolder(&local_150,p0_00,p1_00,p2_00,WHITE);
          msdfgen::Contour::addEdge((Contour *)&edge,&local_150);
          msdfgen::EdgeHolder::~EdgeHolder(&local_150);
          break;
        case '\x04':
          msdfgen::Vector2::Vector2(&local_198,(double)(int)local_d8->cx,(double)(int)local_d8->cy);
          local_b8 = local_198.x;
          dStack_b0 = local_198.y;
          msdfgen::Vector2::Vector2
                    (&local_1a8,(double)(int)local_d8->cx1,(double)(int)local_d8->cy1);
          local_a8 = local_1a8.x;
          dStack_a0 = local_1a8.y;
          msdfgen::Vector2::Vector2(&local_1b8,(double)(int)local_d8->x,(double)(int)local_d8->y);
          local_98 = local_1b8.x;
          dStack_90 = local_1b8.y;
          p0.y = dStack_c0;
          p0.x = _auStack_c8;
          p1.y = dStack_b0;
          p1.x = local_b8;
          p2.y = dStack_a0;
          p2.x = local_a8;
          p3.y = local_1b8.y;
          p3.x = local_1b8.x;
          msdfgen::EdgeHolder::EdgeHolder(&local_1c0,p0,p1,p2,p3,WHITE);
          msdfgen::EdgeHolder::operator=(&local_78,&local_1c0);
          msdfgen::EdgeHolder::~EdgeHolder(&local_1c0);
          msdfgen::Contour::addEdge((Contour *)&edge,&local_78);
        }
        msdfgen::Vector2::Vector2
                  ((Vector2 *)&letter.x1,(double)(int)local_d8->x,(double)(int)local_d8->y);
        _auStack_c8 = (double)letter._24_8_;
        dStack_c0 = local_210;
      }
      if (0 < iVar1) {
        msdfgen::Shape::addContour
                  ((Shape *)&contour.edges.
                             super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(Contour *)&edge);
      }
      registerShape((Shape *)&contour.edges.
                              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Shape *)local_238)
      ;
      psVar2 = this->info;
      iVar1 = stbtt_FindGlyphIndex(psVar2,(int)vertices._7_1_);
      stbtt_GetGlyphHMetrics(psVar2,iVar1,(int *)&letter,&letter.shape.yoff);
      psVar2 = this->info;
      iVar1 = stbtt_FindGlyphIndex(psVar2,(int)vertices._7_1_);
      stbtt_GetGlyphBox(psVar2,iVar1,&letter.advanceWidth,&letter.leftSideBearing,&letter.x0,
                        &letter.y0);
      std::vector<piksel::Letter,_std::allocator<piksel::Letter>_>::push_back
                (&this->letters,(value_type *)local_238);
      msdfgen::EdgeHolder::~EdgeHolder(&local_78);
      msdfgen::Contour::~Contour((Contour *)&edge);
      msdfgen::Shape::~Shape
                ((Shape *)&contour.edges.
                           super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Font::_load(const unsigned char* fontBuffer) {
    info = new stbtt_fontinfo();
    if (!stbtt_InitFont(info, fontBuffer, 0)) {
        fputs("Failed to load font", stderr);
        return 0;
    }
    stbtt_GetFontVMetrics(info, &ascent, &descent, &lineGap);
    stbtt_GetFontBoundingBox(info, &x0, &y1, &x1, &y1);

    for (char ch = ' '; ch <= '~'; ch++) {
        stbtt_vertex* vertices;
        int num_verts = stbtt_GetGlyphShape(info, stbtt_FindGlyphIndex(info, ch), &vertices);
        
        msdfgen::Shape shape;
        msdfgen::Contour contour;
        msdfgen::EdgeHolder edge;
        msdfgen::Point2 p[4];
        for (int i = 0; i < num_verts; i++) {
            stbtt_vertex* vertex = vertices + i;
            switch(vertex->type) {
                case STBTT_vmove:
                    if (i > 0) {
                        shape.addContour(contour);
                        contour = msdfgen::Contour();
                    }
                    break;
                case STBTT_vline:
                    p[1] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1]));
                    break;
                case STBTT_vcurve:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1], p[2]));
                    break;
                case STBTT_vcubic:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->cx1, (double) vertex->cy1);
                    p[3] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    edge = msdfgen::EdgeHolder(p[0], p[1], p[2], p[3]);
                    contour.addEdge(edge);
                    break;
            }
            p[0] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
        }
        if (num_verts > 0) {
            shape.addContour(contour);
        }

        Letter letter;
        registerShape(shape, letter.shape);

        stbtt_GetGlyphHMetrics(info, stbtt_FindGlyphIndex(info, ch), &letter.advanceWidth, &letter.leftSideBearing);
        stbtt_GetGlyphBox(info, stbtt_FindGlyphIndex(info, ch), &letter.x0, &letter.y0, &letter.x1, &letter.y1);

        letters.push_back(letter);
    }

    return 1;
}